

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O0

void __thiscall libebml::UTFstring::UTFstring(UTFstring *this,wstring *_aBuf)

{
  wchar_t *_aBuf_00;
  wstring *_aBuf_local;
  UTFstring *this_local;
  
  this->_vptr_UTFstring = (_func_int **)&PTR__UTFstring_00236e90;
  this->_Length = 0;
  this->_Data = (wchar_t *)0x0;
  std::__cxx11::string::string((string *)&this->UTF8string);
  _aBuf_00 = (wchar_t *)std::__cxx11::wstring::c_str();
  operator=(this,_aBuf_00);
  return;
}

Assistant:

UTFstring::UTFstring(std::wstring const &_aBuf)
  :_Length(0)
  ,_Data(NULL)
{
  *this = _aBuf.c_str();
}